

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi)

{
  int iVar1;
  secp256k1_scratch *scratch;
  ecmult_multi_data data;
  secp256k1_scalar sc;
  secp256k1_ge pt;
  secp256k1_gej r;
  secp256k1_scalar *local_150;
  secp256k1_ge *local_148;
  secp256k1_scalar local_140;
  secp256k1_ge local_120;
  secp256k1_gej local_b8;
  
  testutil_random_ge_test(&local_120);
  testutil_random_scalar_order(&local_140);
  local_150 = &local_140;
  local_148 = &local_120;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0);
  iVar1 = (*ecmult_multi)(&CTX->error_callback,scratch,&local_b8,&secp256k1_scalar_zero,
                          ecmult_multi_callback,&local_150,1);
  if (iVar1 == 0) {
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x13b0,
          "test condition failed: !ecmult_multi(&CTX->error_callback, scratch_empty, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
         );
  abort();
}

Assistant:

static void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi) {
    secp256k1_scalar sc;
    secp256k1_ge pt;
    secp256k1_gej r;
    ecmult_multi_data data;
    secp256k1_scratch *scratch_empty;

    testutil_random_ge_test(&pt);
    testutil_random_scalar_order(&sc);
    data.sc = &sc;
    data.pt = &pt;

    /* Try to multiply 1 point, but scratch space is empty.*/
    scratch_empty = secp256k1_scratch_create(&CTX->error_callback, 0);
    CHECK(!ecmult_multi(&CTX->error_callback, scratch_empty, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch_empty);
}